

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

size_t google::protobuf::internal::WireFormat::ComputeUnknownMessageSetItemsSize
                 (UnknownFieldSet *unknown_fields)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  pointer pUVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  LogMessage *other;
  uint uVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  LogFinisher local_71;
  long local_70;
  LogMessage local_68;
  
  local_70 = 4;
  lVar9 = 8;
  lVar10 = 0;
  sVar8 = 0;
  while( true ) {
    pvVar1 = unknown_fields->fields_;
    if (pvVar1 == (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   *)0x0) {
      lVar6 = 0;
    }
    else {
      lVar6 = (long)(int)((ulong)((long)(pvVar1->
                                        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pvVar1->
                                       super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                       )._M_impl.super__Vector_impl_data._M_start) >> 4);
    }
    if (lVar6 <= lVar10) break;
    if (pvVar1 == (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   *)0x0) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
                 ,0x11c);
      other = LogMessage::operator<<(&local_68,"CHECK failed: fields_ != NULL: ");
      LogFinisher::operator=(&local_71,other);
      LogMessage::~LogMessage(&local_68);
    }
    pUVar2 = (unknown_fields->fields_->
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (*(int *)((long)pUVar2 + lVar9 + -4) == 3) {
      uVar7 = *(uint *)((long)pUVar2 + lVar9 + -8) | 1;
      iVar3 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar7 = (uint)*(undefined8 *)(*(long *)((long)&pUVar2->number_ + lVar9) + 8);
      uVar5 = uVar7 | 1;
      iVar4 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar8 = (long)(int)uVar7 + sVar8 + local_70 + (ulong)(iVar3 * 9 + 0x49U >> 6) +
              (ulong)(iVar4 * 9 + 0x49U >> 6);
    }
    lVar10 = lVar10 + 1;
    lVar9 = lVar9 + 0x10;
  }
  return sVar8;
}

Assistant:

size_t WireFormat::ComputeUnknownMessageSetItemsSize(
    const UnknownFieldSet& unknown_fields) {
  size_t size = 0;
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    // The only unknown fields that are allowed to exist in a MessageSet are
    // messages, which are length-delimited.
    if (field.type() == UnknownField::TYPE_LENGTH_DELIMITED) {
      size += WireFormatLite::kMessageSetItemTagsSize;
      size += io::CodedOutputStream::VarintSize32(field.number());

      int field_size = field.GetLengthDelimitedSize();
      size += io::CodedOutputStream::VarintSize32(field_size);
      size += field_size;
    }
  }

  return size;
}